

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::verifyTimestamp
          (TestStatus *__return_storage_ptr__,TimestampTestInstance *this)

{
  ulong uVar1;
  size_type sVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  uint local_20;
  uint local_1c;
  deUint32 second;
  deUint32 first;
  TimestampTestInstance *this_local;
  
  local_1c = 0;
  _second = this;
  this_local = (TimestampTestInstance *)__return_storage_ptr__;
  do {
    uVar1 = (ulong)local_1c;
    sVar2 = std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::
            size(&this->m_stages);
    if (sVar2 <= uVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Timestamp increases steadily.",&local_79);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      return __return_storage_ptr__;
    }
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      if (this->m_timestampValues[local_1c] < this->m_timestampValues[local_20]) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,
                   "Latter stage timestamp is smaller than the former stage timestamp.",&local_41);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator(&local_41);
        return __return_storage_ptr__;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

tcu::TestStatus TimestampTestInstance::verifyTimestamp(void)
{
	for (deUint32 first = 0; first < m_stages.size(); first++)
	{
		for (deUint32 second = 0; second < first; second++)
		{
			if(m_timestampValues[first] < m_timestampValues[second])
			{
				return tcu::TestStatus::fail("Latter stage timestamp is smaller than the former stage timestamp.");
			}
		}
	}

	return tcu::TestStatus::pass("Timestamp increases steadily.");
}